

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O1

bool __thiscall basisu::basis_compressor::process_backend(basis_compressor *this)

{
  uint32_t uVar1;
  basisu_backend_params backend_params;
  
  debug_printf("basis_compressor::process_backend\n");
  basisu_backend::init(&this->m_backend,(EVP_PKEY_CTX *)&this->m_frontend);
  uVar1 = basisu_backend::encode(&this->m_backend);
  if (uVar1 == 0) {
    error_printf("basis_compressor::encode() failed!\n");
  }
  else {
    debug_printf("Total packed bytes (estimated): %u\n",(ulong)uVar1);
  }
  return uVar1 != 0;
}

Assistant:

bool basis_compressor::process_backend()
	{
		debug_printf("basis_compressor::process_backend\n");

		basisu_backend_params backend_params;
		backend_params.m_debug = m_params.m_debug;
		backend_params.m_debug_images = m_params.m_debug_images;
		backend_params.m_etc1s = true;
		backend_params.m_compression_level = m_params.m_compression_level;
		
		if (!m_params.m_no_endpoint_rdo)
			backend_params.m_endpoint_rdo_quality_thresh = m_params.m_endpoint_rdo_thresh;

		if (!m_params.m_no_selector_rdo)
			backend_params.m_selector_rdo_quality_thresh = m_params.m_selector_rdo_thresh;
				
		backend_params.m_used_global_codebooks = m_frontend.get_params().m_pGlobal_codebooks != nullptr;
		backend_params.m_validate = m_params.m_validate_output_data;

		m_backend.init(&m_frontend, backend_params, m_slice_descs);
		uint32_t total_packed_bytes = m_backend.encode();

		if (!total_packed_bytes)
		{
			error_printf("basis_compressor::encode() failed!\n");
			return false;
		}

		debug_printf("Total packed bytes (estimated): %u\n", total_packed_bytes);

		return true;
	}